

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

pair<const_void_*,_int> __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
FindSymbol(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *name)

{
  bool bVar1;
  iterator sub_symbol;
  iterator super_symbol;
  pointer ppVar2;
  DescriptorIndex<std::pair<const_void_*,_int>_> *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
  *in_RDI;
  pair<const_void_*,_int> pVar3;
  iterator iter;
  _Self in_stack_ffffffffffffffd0;
  _Self in_stack_ffffffffffffffd8;
  pair<const_void_*,_int> local_10;
  
  sub_symbol = FindLastLessOrEqual(in_stack_ffffffffffffffd8._M_node,
                                   in_stack_ffffffffffffffd0._M_node);
  super_symbol = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
                 ::end(in_RDI);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,(_Self *)&stack0xffffffffffffffd0);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
                  *)0x532647);
    bVar1 = IsSubSymbol(in_RSI,(string *)sub_symbol._M_node,(string *)super_symbol._M_node);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
                             *)0x532668);
      local_10.first = (ppVar2->second).first;
      local_10.second = (int)*(undefined8 *)&(ppVar2->second).second;
      goto LAB_00532686;
    }
  }
  std::pair<const_void_*,_int>::pair<const_void_*,_int,_true>(&local_10);
LAB_00532686:
  pVar3.second = local_10.second;
  pVar3.first = local_10.first;
  pVar3._12_4_ = 0;
  return pVar3;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindSymbol(
    const std::string& name) {
  typename std::map<std::string, Value>::iterator iter =
      FindLastLessOrEqual(name);

  return (iter != by_symbol_.end() && IsSubSymbol(iter->first, name))
             ? iter->second
             : Value();
}